

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta_test.c
# Opt level: O1

void * meta_test(void *param)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  MppMeta meta;
  MppBuffer buffer;
  RK_S32 val;
  void *ptr;
  MppPacket packet;
  MppFrame frame;
  long local_128;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  int local_6c;
  long local_68;
  long *local_60;
  undefined1 local_58 [12];
  undefined1 local_4c [4];
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  local_128 = 0;
  local_60 = (long *)param;
  local_68 = mpp_time();
  iVar8 = 100000;
  uVar1 = 0;
  do {
    local_70 = uVar1;
    local_6c = iVar8;
    local_74 = mpp_meta_get_with_tag(&local_128,"mpp_meta_test","meta_test");
    if (local_128 == 0) {
      _mpp_log_l(2,"mpp_meta_test","Assertion %s failed at %s:%d\n",0,"meta","meta_test",0x2e);
      if ((DAT_00105083 & 0x10) != 0) {
        abort();
      }
    }
    local_78 = mpp_meta_set_frame(local_128,0x6966726d,0);
    local_7c = mpp_meta_set_packet(local_128,0x69706b74,0);
    local_80 = mpp_meta_set_frame(local_128,0x6f66726d,0);
    local_84 = mpp_meta_set_packet(local_128,0x6f706b74,0);
    local_88 = mpp_meta_set_buffer(local_128,0x6d766966,0);
    local_8c = mpp_meta_set_buffer(local_128,0x68647220,0);
    local_90 = mpp_meta_set_s32(local_128,0x69626c6b,0);
    local_94 = mpp_meta_set_s32(local_128,0x6f626c6b,0);
    local_98 = mpp_meta_set_s32(local_128,0x69696472,0);
    local_9c = mpp_meta_set_s32(local_128,0x6f696472,0);
    local_a0 = mpp_meta_set_s32(local_128,0x746c6964,0);
    local_a4 = mpp_meta_set_s32(local_128,0x6c746964,0);
    local_a8 = mpp_meta_set_s32(local_128,0x61766771,0);
    local_ac = mpp_meta_set_ptr(local_128,0x726f6920,0);
    local_b0 = mpp_meta_set_ptr(local_128,0x6f736420,0);
    local_b4 = mpp_meta_set_ptr(local_128,0x6f736432,0);
    uVar1 = mpp_meta_set_ptr(local_128,0x75737264,0);
    local_b8 = mpp_meta_set_ptr(local_128,0x75726473,0);
    local_bc = mpp_meta_set_buffer(local_128,0x65716d30,0);
    local_c0 = mpp_meta_set_ptr(local_128,0x6d766c74,0);
    local_c4 = mpp_meta_set_s32(local_128,0x6d6c7472,0);
    local_c8 = mpp_meta_set_s32(local_128,0x756c7472,0);
    uVar2 = mpp_meta_set_s32(local_128,0x66726d71,0);
    local_cc = mpp_meta_set_s32(local_128,0x62706964,0);
    local_d0 = mpp_meta_get_frame(local_128,0x6966726d,local_38);
    local_d4 = mpp_meta_get_packet(local_128,0x69706b74,local_40);
    local_d8 = mpp_meta_get_frame(local_128,0x6f66726d,local_38);
    local_dc = mpp_meta_get_packet(local_128,0x6f706b74,local_40);
    local_e0 = mpp_meta_get_buffer(local_128,0x6d766966,local_58);
    uVar3 = mpp_meta_get_buffer(local_128,0x68647220,local_58);
    local_e4 = mpp_meta_get_s32(local_128,0x69626c6b,local_4c);
    local_e8 = mpp_meta_get_s32(local_128,0x6f626c6b,local_4c);
    local_ec = mpp_meta_get_s32(local_128,0x69696472,local_4c);
    local_f0 = mpp_meta_get_s32(local_128,0x6f696472,local_4c);
    local_f4 = mpp_meta_get_s32(local_128,0x746c6964,local_4c);
    local_f8 = mpp_meta_get_s32(local_128,0x6c746964,local_4c);
    local_fc = mpp_meta_get_s32(local_128,0x61766771,local_4c);
    uVar4 = mpp_meta_get_ptr(local_128,0x726f6920,local_48);
    local_100 = mpp_meta_get_ptr(local_128,0x6f736420,local_48);
    local_104 = mpp_meta_get_ptr(local_128,0x6f736432,local_48);
    local_108 = mpp_meta_get_ptr(local_128,0x75737264,local_48);
    local_10c = mpp_meta_get_ptr(local_128,0x75726473,local_48);
    local_110 = mpp_meta_get_buffer(local_128,0x65716d30,local_58);
    local_114 = mpp_meta_get_ptr(local_128,0x6d766c74,local_48);
    local_118 = mpp_meta_get_s32(local_128,0x6d6c7472,local_4c);
    local_11c = mpp_meta_get_s32(local_128,0x756c7472,local_4c);
    uVar5 = mpp_meta_get_s32(local_128,0x66726d71,local_4c);
    uVar6 = mpp_meta_get_s32(local_128,0x62706964,local_4c);
    uVar7 = mpp_meta_put(local_128);
    uVar1 = uVar5 | local_11c | uVar6 | uVar7 |
            uVar4 | local_fc | local_100 | local_104 | local_108 | local_10c | local_110 | local_114
            | local_118 |
            uVar3 | local_e0 | local_e4 | local_e8 | local_ec | local_f0 | local_f4 | local_f8 |
            uVar2 | local_c8 | local_cc | local_d0 | local_d4 | local_d8 | local_dc |
            uVar1 | local_b4 | local_b8 | local_bc | local_c0 | local_c4 |
            local_a4 | local_a0 | local_a8 | local_ac | local_b0 |
            local_94 | local_90 | local_98 | local_9c |
            local_88 | local_84 | local_8c | local_80 | local_7c | local_74 | local_70 | local_78;
    iVar8 = local_6c + -1;
  } while (iVar8 != 0);
  lVar9 = mpp_time();
  if (uVar1 != 0) {
    _mpp_log_l(4,"mpp_meta_test","meta setting and getting, ret %d\n",0,uVar1);
  }
  *local_60 = (lVar9 - local_68) / 100000;
  return (void *)0x0;
}

Assistant:

void *meta_test(void *param)
{
    RK_S32 loop_max = LOOP_MAX;
    RK_S64 time_start;
    RK_S64 time_end;
    MppMeta meta = NULL;
    MPP_RET ret = MPP_OK;
    MppFrame frame;
    MppPacket packet;
    MppBuffer buffer;
    void *ptr;
    RK_S32 val;
    RK_S32 i;

    time_start = mpp_time();

    for (i = 0; i < loop_max; i++) {
        ret |= mpp_meta_get(&meta);
        mpp_assert(meta);

        /* set */
        ret |= mpp_meta_set_frame(meta,  KEY_INPUT_FRAME, NULL);
        ret |= mpp_meta_set_packet(meta, KEY_INPUT_PACKET, NULL);
        ret |= mpp_meta_set_frame(meta,  KEY_OUTPUT_FRAME, NULL);
        ret |= mpp_meta_set_packet(meta, KEY_OUTPUT_PACKET, NULL);

        ret |= mpp_meta_set_buffer(meta, KEY_MOTION_INFO, NULL);
        ret |= mpp_meta_set_buffer(meta, KEY_HDR_INFO, NULL);

        ret |= mpp_meta_set_s32(meta, KEY_INPUT_BLOCK, 0);
        ret |= mpp_meta_set_s32(meta, KEY_OUTPUT_BLOCK, 0);
        ret |= mpp_meta_set_s32(meta, KEY_INPUT_IDR_REQ, 0);
        ret |= mpp_meta_set_s32(meta, KEY_OUTPUT_INTRA, 0);

        ret |= mpp_meta_set_s32(meta, KEY_TEMPORAL_ID, 0);
        ret |= mpp_meta_set_s32(meta, KEY_LONG_REF_IDX, 0);
        ret |= mpp_meta_set_s32(meta, KEY_ENC_AVERAGE_QP, 0);

        ret |= mpp_meta_set_ptr(meta, KEY_ROI_DATA, NULL);
        ret |= mpp_meta_set_ptr(meta, KEY_OSD_DATA, NULL);
        ret |= mpp_meta_set_ptr(meta, KEY_OSD_DATA2, NULL);
        ret |= mpp_meta_set_ptr(meta, KEY_USER_DATA, NULL);
        ret |= mpp_meta_set_ptr(meta, KEY_USER_DATAS, NULL);

        ret |= mpp_meta_set_buffer(meta, KEY_QPMAP0, NULL);
        ret |= mpp_meta_set_ptr(meta, KEY_MV_LIST, NULL);

        ret |= mpp_meta_set_s32(meta, KEY_ENC_MARK_LTR, 0);
        ret |= mpp_meta_set_s32(meta, KEY_ENC_USE_LTR, 0);
        ret |= mpp_meta_set_s32(meta, KEY_ENC_FRAME_QP, 0);
        ret |= mpp_meta_set_s32(meta, KEY_ENC_BASE_LAYER_PID, 0);

        /* get */
        ret |= mpp_meta_get_frame(meta,  KEY_INPUT_FRAME, &frame);
        ret |= mpp_meta_get_packet(meta, KEY_INPUT_PACKET, &packet);
        ret |= mpp_meta_get_frame(meta,  KEY_OUTPUT_FRAME, &frame);
        ret |= mpp_meta_get_packet(meta, KEY_OUTPUT_PACKET, &packet);

        ret |= mpp_meta_get_buffer(meta, KEY_MOTION_INFO, &buffer);
        ret |= mpp_meta_get_buffer(meta, KEY_HDR_INFO, &buffer);

        ret |= mpp_meta_get_s32(meta, KEY_INPUT_BLOCK, &val);
        ret |= mpp_meta_get_s32(meta, KEY_OUTPUT_BLOCK, &val);
        ret |= mpp_meta_get_s32(meta, KEY_INPUT_IDR_REQ, &val);
        ret |= mpp_meta_get_s32(meta, KEY_OUTPUT_INTRA, &val);

        ret |= mpp_meta_get_s32(meta, KEY_TEMPORAL_ID, &val);
        ret |= mpp_meta_get_s32(meta, KEY_LONG_REF_IDX, &val);
        ret |= mpp_meta_get_s32(meta, KEY_ENC_AVERAGE_QP, &val);

        ret |= mpp_meta_get_ptr(meta, KEY_ROI_DATA, &ptr);
        ret |= mpp_meta_get_ptr(meta, KEY_OSD_DATA, &ptr);
        ret |= mpp_meta_get_ptr(meta, KEY_OSD_DATA2, &ptr);
        ret |= mpp_meta_get_ptr(meta, KEY_USER_DATA, &ptr);
        ret |= mpp_meta_get_ptr(meta, KEY_USER_DATAS, &ptr);

        ret |= mpp_meta_get_buffer(meta, KEY_QPMAP0, &buffer);
        ret |= mpp_meta_get_ptr(meta, KEY_MV_LIST, &ptr);

        ret |= mpp_meta_get_s32(meta, KEY_ENC_MARK_LTR, &val);
        ret |= mpp_meta_get_s32(meta, KEY_ENC_USE_LTR, &val);
        ret |= mpp_meta_get_s32(meta, KEY_ENC_FRAME_QP, &val);
        ret |= mpp_meta_get_s32(meta, KEY_ENC_BASE_LAYER_PID, &val);

        ret |= mpp_meta_put(meta);
    }

    time_end = mpp_time();

    if (ret)
        mpp_log("meta setting and getting, ret %d\n", ret);

    *((RK_S64 *)param) = (time_end - time_start) / loop_max;

    return NULL;
}